

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O0

void __thiscall llvm::printHTMLEscaped(llvm *this,StringRef String,raw_ostream *Out)

{
  char C_00;
  iterator pcVar1;
  raw_ostream *this_00;
  char C;
  iterator __end1;
  iterator __begin1;
  StringRef *__range1;
  raw_ostream *Out_local;
  StringRef String_local;
  
  this_00 = (raw_ostream *)String.Length;
  String_local.Data = String.Data;
  Out_local = (raw_ostream *)this;
  __end1 = StringRef::begin((StringRef *)&Out_local);
  pcVar1 = StringRef::end((StringRef *)&Out_local);
  for (; __end1 != pcVar1; __end1 = __end1 + 1) {
    C_00 = *__end1;
    if (C_00 == '&') {
      raw_ostream::operator<<(this_00,"&amp;");
    }
    else if (C_00 == '<') {
      raw_ostream::operator<<(this_00,"&lt;");
    }
    else if (C_00 == '>') {
      raw_ostream::operator<<(this_00,"&gt;");
    }
    else if (C_00 == '\"') {
      raw_ostream::operator<<(this_00,"&quot;");
    }
    else if (C_00 == '\'') {
      raw_ostream::operator<<(this_00,"&apos;");
    }
    else {
      raw_ostream::operator<<(this_00,C_00);
    }
  }
  return;
}

Assistant:

void llvm::printHTMLEscaped(StringRef String, raw_ostream &Out) {
  for (char C : String) {
    if (C == '&')
      Out << "&amp;";
    else if (C == '<')
      Out << "&lt;";
    else if (C == '>')
      Out << "&gt;";
    else if (C == '\"')
      Out << "&quot;";
    else if (C == '\'')
      Out << "&apos;";
    else
      Out << C;
  }
}